

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O0

int __thiscall ncnn::Reshape::load_param(Reshape *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  long in_RDI;
  
  iVar1 = ParamDict::get(in_RSI,0,-0xe9);
  *(int *)(in_RDI + 0x80) = iVar1;
  iVar1 = ParamDict::get(in_RSI,1,-0xe9);
  *(int *)(in_RDI + 0x84) = iVar1;
  iVar1 = ParamDict::get(in_RSI,2,-0xe9);
  *(int *)(in_RDI + 0x88) = iVar1;
  iVar1 = ParamDict::get(in_RSI,3,0);
  *(int *)(in_RDI + 0x8c) = iVar1;
  *(undefined4 *)(in_RDI + 0x90) = 3;
  if (*(int *)(in_RDI + 0x88) == -0xe9) {
    *(undefined4 *)(in_RDI + 0x90) = 2;
  }
  if (*(int *)(in_RDI + 0x84) == -0xe9) {
    *(undefined4 *)(in_RDI + 0x90) = 1;
  }
  if (*(int *)(in_RDI + 0x80) == -0xe9) {
    *(undefined4 *)(in_RDI + 0x90) = 0;
  }
  return 0;
}

Assistant:

int Reshape::load_param(const ParamDict& pd)
{
    w = pd.get(0, -233);
    h = pd.get(1, -233);
    c = pd.get(2, -233);
    permute = pd.get(3, 0);

    ndim = 3;
    if (c == -233)
        ndim = 2;
    if (h == -233)
        ndim = 1;
    if (w == -233)
        ndim = 0;

    return 0;
}